

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O1

Music_Emu * new_nsf_file(void)

{
  Music_Emu *this;
  
  this = (Music_Emu *)malloc(0x220);
  if (this == (Music_Emu *)0x0) {
    this = (Music_Emu *)0x0;
  }
  else {
    Music_Emu::Music_Emu(this);
    (this->super_Gme_File)._vptr_Gme_File = (_func_int **)&PTR__Music_Emu_0086cb68;
    (this->super_Gme_File).type_ = &gme_nsf_type_;
  }
  return this;
}

Assistant:

Nsf_File() { set_type( gme_nsf_type ); }